

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

SmallVector<spirv_cross::BufferRange,_8UL> * __thiscall
spirv_cross::Compiler::get_active_buffer_ranges
          (SmallVector<spirv_cross::BufferRange,_8UL> *__return_storage_ptr__,Compiler *this,
          VariableID id)

{
  SPIRFunction *func;
  BufferAccessHandler handler;
  BufferAccessHandler local_68;
  
  (__return_storage_ptr__->super_VectorView<spirv_cross::BufferRange>).buffer_size = 0;
  (__return_storage_ptr__->super_VectorView<spirv_cross::BufferRange>).ptr =
       (BufferRange *)&__return_storage_ptr__->stack_storage;
  __return_storage_ptr__->buffer_capacity = 8;
  local_68.seen._M_h._M_buckets = &local_68.seen._M_h._M_single_bucket;
  local_68.super_OpcodeHandler._vptr_OpcodeHandler =
       (_func_int **)&PTR__BufferAccessHandler_0043d428;
  local_68.seen._M_h._M_bucket_count = 1;
  local_68.seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68.seen._M_h._M_element_count = 0;
  local_68.seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_68.seen._M_h._M_rehash_policy._M_next_resize = 0;
  local_68.seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_68.compiler = this;
  local_68.ranges = __return_storage_ptr__;
  local_68.id = id.id;
  func = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_68.super_OpcodeHandler);
  BufferAccessHandler::~BufferAccessHandler(&local_68);
  return __return_storage_ptr__;
}

Assistant:

SmallVector<BufferRange> Compiler::get_active_buffer_ranges(VariableID id) const
{
	SmallVector<BufferRange> ranges;
	BufferAccessHandler handler(*this, ranges, id);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	return ranges;
}